

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

int cpu_ldsw_data_ra_sparc(CPUArchState_conflict16 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  uint uVar2;
  
  uVar2 = 2;
  if ((env->mmuregs[0] & 1) != 0) {
    uVar2 = env->psrs;
  }
  uVar1 = load_helper(env,ptr,uVar2 | 0x90,retaddr,MO_BEUW,false,full_be_lduw_mmu);
  return (int)(short)uVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}